

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O1

ON_ScaleValue *
ON_ScaleValue::CreateFromString
          (ON_ScaleValue *__return_storage_ptr__,ON_ParseSettings parse_settings,wchar_t *string)

{
  ON_ScaleValue *__return_storage_ptr___00;
  ON_ScaleValue scale_value;
  wchar_t *local_a8;
  ON_ScaleValue local_a0;
  
  if ((string == (wchar_t *)0x0) || (*string == L'\0')) {
    ON_ScaleValue(__return_storage_ptr__,&Unset);
  }
  else {
    local_a8 = (wchar_t *)0x0;
    __return_storage_ptr___00 = &local_a0;
    CreateFromSubString(__return_storage_ptr___00,parse_settings,string,-1,&local_a8);
    if (local_a8 <= string) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
                 ,0x4a0,"","Invalid input parameters.");
      __return_storage_ptr___00 = &Unset;
    }
    ON_ScaleValue(__return_storage_ptr__,__return_storage_ptr___00);
    ~ON_ScaleValue(&local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

ON_ScaleValue ON_ScaleValue::CreateFromString(
  ON_ParseSettings parse_settings,
  const wchar_t* string
  )
{
  if ( nullptr == string || 0 == string[0] )
    return ON_ScaleValue::Unset;

  const wchar_t* string_end = nullptr;
  const ON_ScaleValue scale_value = ON_ScaleValue::CreateFromSubString(parse_settings, string, -1, &string_end);
  if (nullptr == string_end || !(string < string_end))
  {
    ON_ERROR("Invalid input parameters.");
    return ON_ScaleValue::Unset;
  }

  return scale_value;
}